

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall boost::condition_error::condition_error(condition_error *this,int ev,char *what_arg)

{
  error_category *cat;
  int in_ESI;
  system_error *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  error_code in_stack_ffffffffffffffd8;
  
  cat = system::generic_category();
  system::error_code::error_code((error_code *)&stack0xffffffffffffffd8,in_ESI,cat);
  system::system_error::system_error
            (in_RDI,in_stack_ffffffffffffffd8,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8));
  *(undefined ***)in_RDI = &PTR__condition_error_00305aa8;
  return;
}

Assistant:

condition_error( int ev, const char * what_arg )
          : base_type(system::error_code(ev, system::generic_category()), what_arg)
          {
          }